

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImTriangleBarycentricCoords
               (ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *p,float *out_u,float *out_v,float *out_w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  fVar7 = a->x;
  fVar1 = a->y;
  fVar2 = b->y - fVar1;
  fVar3 = c->x - fVar7;
  fVar4 = p->x - fVar7;
  fVar5 = p->y - fVar1;
  auVar8 = ZEXT416((uint)(b->x - fVar7));
  auVar9 = ZEXT416((uint)(c->y - fVar1));
  auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar3)),auVar8,auVar9);
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar3)),ZEXT416((uint)fVar4),auVar9);
  *out_v = auVar9._0_4_ / auVar6._0_4_;
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar4)),auVar8,ZEXT416((uint)fVar5));
  fVar7 = auVar9._0_4_ / auVar6._0_4_;
  *out_w = fVar7;
  *out_u = (1.0 - *out_v) - fVar7;
  return;
}

Assistant:

void ImTriangleBarycentricCoords(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& p, float& out_u, float& out_v, float& out_w)
{
    ImVec2 v0 = b - a;
    ImVec2 v1 = c - a;
    ImVec2 v2 = p - a;
    const float denom = v0.x * v1.y - v1.x * v0.y;
    out_v = (v2.x * v1.y - v1.x * v2.y) / denom;
    out_w = (v0.x * v2.y - v2.x * v0.y) / denom;
    out_u = 1.0f - out_v - out_w;
}